

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O3

Vec_Int_t * Abc_NtkDressMapClasses(Aig_Man_t *pMiter,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  ulong uVar6;
  ulong uVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  ulong uVar10;
  
  pVVar5 = (Vec_Int_t *)calloc(1,0x10);
  pVVar2 = pNtk->vObjs;
  iVar1 = pVVar2->nSize;
  uVar10 = (ulong)iVar1;
  if ((long)uVar10 < 1) {
    pVVar5->nSize = iVar1;
  }
  else {
    __s = (int *)malloc(uVar10 * 4);
    pVVar5->pArray = __s;
    if (__s == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = iVar1;
    memset(__s,0xff,uVar10 * 4);
    pVVar5->nSize = iVar1;
    ppvVar3 = pVVar2->pArray;
    uVar6 = 0;
    do {
      pvVar4 = ppvVar3[uVar6];
      if (((((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) &&
           (uVar7 = *(ulong *)((long)pvVar4 + 0x40) & 0xfffffffffffffffe, uVar7 != 0)) &&
          (((*(byte *)(uVar7 + 0x14) & 0xf) != 0 &&
           (uVar7 = *(ulong *)(uVar7 + 0x40) & 0xfffffffffffffffe, uVar7 != 0)))) &&
         (((*(byte *)(uVar7 + 0x18) & 7) != 0 &&
          ((pAVar8 = (Aig_Obj_t *)(*(ulong *)(uVar7 + 0x28) & 0xfffffffffffffffe),
           pAVar8 != (Aig_Obj_t *)0x0 && ((pAVar8->field_0x18 & 7) != 0)))))) {
        if (pMiter->pReprs == (Aig_Obj_t **)0x0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = pMiter->pReprs[pAVar8->Id];
        }
        if (uVar10 <= uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        if (pAVar9 != (Aig_Obj_t *)0x0) {
          pAVar8 = pAVar9;
        }
        __s[uVar6] = pAVar8->Id;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar10);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkDressMapClasses( Aig_Man_t * pMiter, Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vId2Lit;
    Abc_Obj_t * pObj, * pAnd;
    Aig_Obj_t * pObjMan, * pObjMiter, * pObjRepr;
    int i;
    vId2Lit = Vec_IntAlloc( 0 );
    Vec_IntFill( vId2Lit, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // get the pointer to the miter node corresponding to pObj
        if ( (pAnd = Abc_ObjRegular(pObj->pCopy)) && Abc_ObjType(pAnd) != ABC_OBJ_NONE &&          // strashed node is present and legal
             (pObjMan = Aig_Regular((Aig_Obj_t *)pAnd->pCopy)) && Aig_ObjType(pObjMan) != AIG_OBJ_NONE &&       // AIG node is present and legal
             (pObjMiter = Aig_Regular((Aig_Obj_t *)pObjMan->pData)) && Aig_ObjType(pObjMiter) != AIG_OBJ_NONE ) // miter node is present and legal
        {
            // get the representative of the miter node
            pObjRepr = Aig_ObjRepr( pMiter, pObjMiter );
            pObjRepr = pObjRepr? pObjRepr : pObjMiter;
            // map pObj (whose ID is i) into the repr node ID (i.e. equiv class)
            Vec_IntWriteEntry( vId2Lit, i, Aig_ObjId(pObjRepr) );
        }
    }
    return vId2Lit;
}